

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O2

void __thiscall Qentem::QTest::PrintGroupName(QTest *this)

{
  char *local_20;
  char *local_18;
  
  local_18 = TestOutPut::GetColor(TITLE);
  local_20 = TestOutPut::GetColor(END);
  TestOutPut::Print<char_const*,char_const*,char_const*,char[3]>
            (&local_18,&this->test_name_,&local_20,(char (*) [3])0x10a04b);
  return;
}

Assistant:

QENTEM_NOINLINE void PrintGroupName() const {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), test_name_,
                          TestOutPut::GetColor(TestOutPut::Colors::END), ":\n");
    }